

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  int local_40;
  int local_3c;
  int iLit_2;
  int k_2;
  int iLit_1;
  int k_1;
  int iLit;
  int k;
  int Type_local;
  int nFans_local;
  int *pFans_local;
  Gia_Man_t *pNew_local;
  
  if ((Type == 0x25) || (Type == 0x28)) {
    iLit_1 = 1;
    for (k_1 = 0; k_1 < nFans; k_1 = k_1 + 1) {
      iLit_1 = Gia_ManHashAnd(pNew,iLit_1,pFans[k_1]);
    }
    pNew_local._4_4_ = Abc_LitNotCond(iLit_1,(uint)(Type == 0x28));
  }
  else if ((Type == 0x26) || (Type == 0x29)) {
    iLit_2 = 0;
    for (k_2 = 0; k_2 < nFans; k_2 = k_2 + 1) {
      iLit_2 = Gia_ManHashOr(pNew,iLit_2,pFans[k_2]);
    }
    pNew_local._4_4_ = Abc_LitNotCond(iLit_2,(uint)(Type == 0x29));
  }
  else {
    if ((Type != 0x27) && (Type != 0x2a)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                    ,0xed,"int Wlc_BlastReduction(Gia_Man_t *, int *, int, int)");
    }
    local_40 = 0;
    for (local_3c = 0; local_3c < nFans; local_3c = local_3c + 1) {
      local_40 = Gia_ManHashXor(pNew,local_40,pFans[local_3c]);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_40,(uint)(Type == 0x2a));
  }
  return pNew_local._4_4_;
}

Assistant:

int Wlc_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == WLC_OBJ_REDUCT_AND || Type == WLC_OBJ_REDUCT_NAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NAND );
    }
    if ( Type == WLC_OBJ_REDUCT_OR || Type == WLC_OBJ_REDUCT_NOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NOR );
    }
    if ( Type == WLC_OBJ_REDUCT_XOR || Type == WLC_OBJ_REDUCT_NXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NXOR );
    }
    assert( 0 );
    return -1;
}